

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int unknowntag_start(archive_read *a,xar *xar,char *name)

{
  int iVar1;
  unknown_tag *puVar2;
  size_t n;
  
  puVar2 = (unknown_tag *)malloc(0x20);
  if (puVar2 == (unknown_tag *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar1 = -0x1e;
  }
  else {
    puVar2->next = xar->unknowntags;
    (puVar2->name).s = (char *)0x0;
    (puVar2->name).length = 0;
    (puVar2->name).buffer_length = 0;
    if (name == (char *)0x0) {
      n = 0;
    }
    else {
      n = strlen(name);
    }
    archive_strncat(&puVar2->name,name,n);
    if (xar->unknowntags == (unknown_tag *)0x0) {
      xar->xmlsts_unknown = xar->xmlsts;
      xar->xmlsts = UNKNOWN;
    }
    xar->unknowntags = puVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
unknowntag_start(struct archive_read *a, struct xar *xar, const char *name)
{
	struct unknown_tag *tag;

	tag = malloc(sizeof(*tag));
	if (tag == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	tag->next = xar->unknowntags;
	archive_string_init(&(tag->name));
	archive_strcpy(&(tag->name), name);
	if (xar->unknowntags == NULL) {
#if DEBUG
		fprintf(stderr, "UNKNOWNTAG_START:%s\n", name);
#endif
		xar->xmlsts_unknown = xar->xmlsts;
		xar->xmlsts = UNKNOWN;
	}
	xar->unknowntags = tag;
	return (ARCHIVE_OK);
}